

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::SwiftCompilerTool::configureAttribute
          (SwiftCompilerTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  Twine local_80;
  Twine local_68;
  Twine local_50;
  ConfigureContext *local_38;
  ConfigureContext *ctx_local;
  SwiftCompilerTool *this_local;
  StringRef value_local;
  StringRef name_local;
  
  value_local.Data = (char *)value.Length;
  this_local = (SwiftCompilerTool *)value.Data;
  value_local.Length = (size_t)name.Data;
  local_38 = ctx;
  ctx_local = (ConfigureContext *)this;
  llvm::operator+(&local_68,"unexpected attribute: \'",(StringRef *)&value_local.Length);
  llvm::Twine::Twine(&local_80,"\'");
  llvm::operator+(&local_50,&local_68,&local_80);
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_50);
  return false;
}

Assistant:

virtual bool configureAttribute(
      const ConfigureContext& ctx, StringRef name, StringRef value) override {
    // No supported attributes.
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }